

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

void __thiscall
llm_build_bitnet::llm_build_bitnet
          (llm_build_bitnet *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *plVar2;
  ggml_tensor *pgVar3;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer plVar9;
  int il;
  int il_00;
  long lVar10;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar11;
  long local_70;
  ggml_tensor *local_58;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar2 = (this->super_llm_graph_context).hparams;
  uVar1 = plVar2->n_embd_head_v;
  if (uVar1 != plVar2->n_embd_head_k) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x283d,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_58 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  pgVar3 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
  inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
  local_70 = 0;
  for (lVar10 = 0; uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20),
      lVar10 < (this->super_llm_graph_context).n_layer; lVar10 = lVar10 + 1) {
    il_00 = (int)lVar10;
    pgVar4 = llm_graph_context::build_norm
                       (&this->super_llm_graph_context,local_58,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->attn_norm + local_70),
                        (ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"attn_norm",il_00);
    pgVar5 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->wq + local_70),pgVar4);
    if (*(long *)((long)&((model->layers).
                          super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                          super__Vector_impl_data._M_start)->wq_scale + local_70) != 0) {
      pgVar5 = (ggml_tensor *)ggml_mul((this->super_llm_graph_context).ctx0,pgVar5);
    }
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Qcur",il_00);
    plVar9 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (*(long *)((long)&plVar9->bq + local_70) != 0) {
      pgVar5 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Qcur",il_00);
      plVar9 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
    }
    pgVar6 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,
                        *(ggml_tensor **)((long)&plVar9->wk + local_70),pgVar4);
    if (*(long *)((long)&((model->layers).
                          super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                          super__Vector_impl_data._M_start)->wk_scale + local_70) != 0) {
      pgVar6 = (ggml_tensor *)ggml_mul((this->super_llm_graph_context).ctx0,pgVar6);
    }
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Kcur",il_00);
    plVar9 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (*(long *)((long)&plVar9->bk + local_70) != 0) {
      pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Kcur",il_00);
      plVar9 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
    }
    pgVar4 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,
                        *(ggml_tensor **)((long)&plVar9->wv + local_70),pgVar4);
    if (*(long *)((long)&((model->layers).
                          super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                          super__Vector_impl_data._M_start)->wv_scale + local_70) != 0) {
      pgVar4 = (ggml_tensor *)ggml_mul((this->super_llm_graph_context).ctx0,pgVar4);
    }
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"Vcur",il_00);
    if (*(long *)((long)&((model->layers).
                          super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                          super__Vector_impl_data._M_start)->bv + local_70) != 0) {
      pgVar4 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar4);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"Vcur",il_00);
    }
    uVar7 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar5,uVar1,
                            (this->super_llm_graph_context).n_head,
                            (long)(this->super_llm_graph_context).n_tokens);
    uVar8 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar6,uVar1,
                            (this->super_llm_graph_context).n_head_kv,
                            (long)(this->super_llm_graph_context).n_tokens);
    pgVar4 = (ggml_tensor *)
             ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar4,uVar1,
                             (this->super_llm_graph_context).n_head_kv,
                             (long)(this->super_llm_graph_context).n_tokens);
    pgVar5 = (ggml_tensor *)
             ggml_rope_ext((this->super_llm_graph_context).freq_base,
                           (this->super_llm_graph_context).freq_scale,
                           (this->super_llm_graph_context).ext_factor,
                           (this->super_llm_graph_context).attn_factor,
                           (this->super_llm_graph_context).beta_fast,
                           (this->super_llm_graph_context).beta_slow,
                           (this->super_llm_graph_context).ctx0,uVar7,pgVar3,0,
                           (int)(this->super_llm_graph_context).n_rot,
                           (this->super_llm_graph_context).rope_type,
                           CONCAT44(uVar11,(this->super_llm_graph_context).n_ctx_orig));
    pgVar6 = (ggml_tensor *)
             ggml_rope_ext((this->super_llm_graph_context).freq_base,
                           (this->super_llm_graph_context).freq_scale,
                           (this->super_llm_graph_context).ext_factor,
                           (this->super_llm_graph_context).attn_factor,
                           (this->super_llm_graph_context).beta_fast,
                           (this->super_llm_graph_context).beta_slow,
                           (this->super_llm_graph_context).ctx0,uVar8,pgVar3,0,
                           (int)(this->super_llm_graph_context).n_rot,
                           (this->super_llm_graph_context).rope_type,
                           (this->super_llm_graph_context).n_ctx_orig);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Qcur",il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Kcur",il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"Vcur",il_00);
    pgVar4 = llm_graph_context::build_attn
                       (&this->super_llm_graph_context,inp,gf,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                        pgVar5,pgVar6,pgVar4,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                        1.0 / SQRT((float)uVar1),il_00);
    pgVar4 = llm_graph_context::build_norm
                       (&this->super_llm_graph_context,pgVar4,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->attn_sub_norm +
                         local_70),(ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"attn_sub_norm",il_00);
    pgVar4 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->wo + local_70),pgVar4);
    plVar9 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (*(long *)((long)&plVar9->wo_scale + local_70) != 0) {
      pgVar4 = (ggml_tensor *)ggml_mul((this->super_llm_graph_context).ctx0,pgVar4);
      plVar9 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
    }
    if (*(long *)((long)&plVar9->bo + local_70) != 0) {
      pgVar4 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar4);
    }
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"attn_o_out",il_00);
    if (lVar10 == (this->super_llm_graph_context).n_layer + -1) {
      pgVar5 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
      pgVar4 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar4,pgVar5);
      local_58 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,local_58,pgVar5);
    }
    pgVar4 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar4,local_58);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"ffn_inp",il_00);
    pgVar5 = llm_graph_context::build_norm
                       (&this->super_llm_graph_context,pgVar4,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ffn_norm + local_70),
                        (ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_norm",il_00);
    plVar9 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    in_stack_ffffffffffffff48 = 0;
    pgVar5 = llm_graph_context::build_ffn
                       (&this->super_llm_graph_context,pgVar5,
                        *(ggml_tensor **)((long)&plVar9->ffn_up + local_70),(ggml_tensor *)0x0,
                        *(ggml_tensor **)((long)&plVar9->ffn_up_scale + local_70),
                        *(ggml_tensor **)((long)&plVar9->ffn_gate + local_70),(ggml_tensor *)0x0,
                        *(ggml_tensor **)((long)&plVar9->ffn_gate_scale + local_70),
                        (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                        LLM_FFN_SILU,LLM_FFN_PAR,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_sub_out",il_00);
    pgVar5 = llm_graph_context::build_norm
                       (&this->super_llm_graph_context,pgVar5,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ffn_sub_norm + local_70
                         ),(ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_sub_norm",il_00);
    pgVar5 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ffn_down + local_70),
                        pgVar5);
    if (*(long *)((long)&((model->layers).
                          super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                          super__Vector_impl_data._M_start)->ffn_down_scale + local_70) != 0) {
      pgVar5 = (ggml_tensor *)ggml_mul((this->super_llm_graph_context).ctx0,pgVar5);
    }
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_down",il_00);
    local_58 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5,pgVar4);
    llm_graph_context::cb(&this->super_llm_graph_context,local_58,"l_out",il_00);
    local_70 = local_70 + 0x4f0;
  }
  pgVar3 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,local_58,model->output_norm,(ggml_tensor *)0x0,
                      LLM_NORM_RMS,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar3,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar3;
  pgVar3 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->tok_embd,pgVar3);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar3,"result_output",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar3;
  ggml_build_forward_expand(gf,pgVar3);
  return;
}

Assistant:

llm_build_bitnet(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                if (model.layers[il].wq_scale) {
                    Qcur = ggml_mul(ctx0, Qcur, model.layers[il].wq_scale);
                }
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                // B1.K
                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                if (model.layers[il].wk_scale) {
                    Kcur = ggml_mul(ctx0, Kcur, model.layers[il].wk_scale);
                }
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                // B1.V
                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                if (model.layers[il].wv_scale) {
                    Vcur = ggml_mul(ctx0, Vcur, model.layers[il].wv_scale);
                }
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        NULL, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);

                cur = build_norm(cur,
                        model.layers[il].attn_sub_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "attn_sub_norm", il);

                cur = build_lora_mm(model.layers[il].wo, cur);
                if (model.layers[il].wo_scale) {
                    cur = ggml_mul(ctx0, cur, model.layers[il].wo_scale);
                }
                if (model.layers[il].bo) {
                    cur = ggml_add(ctx0, cur, model.layers[il].bo);
                }
                cb(cur, "attn_o_out", il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward forward
            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   NULL, model.layers[il].ffn_up_scale,
                    model.layers[il].ffn_gate, NULL, model.layers[il].ffn_gate_scale,
                    NULL,                      NULL, NULL,
                    NULL,
                    LLM_FFN_SILU, LLM_FFN_PAR, il);
            cb(cur, "ffn_sub_out", il);

            cur = build_norm(cur,
                    model.layers[il].ffn_sub_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_sub_norm", il);

            cur = build_lora_mm(model.layers[il].ffn_down, cur);
            if (model.layers[il].ffn_down_scale) {
                cur = ggml_mul(ctx0, cur, model.layers[il].ffn_down_scale);
            }
            cb(cur, "ffn_down", il);

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        // FIXME: do not use model.tok_embd directly, duplicate as model.output
        cur = build_lora_mm(model.tok_embd, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }